

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_16_frc_aw(void)

{
  uint uVar1;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) != 0) {
    uVar1 = m68ki_read_imm_16();
    m68ki_write_16_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,
                      m68ki_cpu.c_flag >> 8 & 1 |
                      m68ki_cpu.v_flag >> 6 & 2 |
                      (m68ki_cpu.n_flag >> 4 & 8 | m68ki_cpu.x_flag >> 4 & 0x10) +
                      (uint)(m68ki_cpu.not_z_flag == 0) * 4);
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_move_16_frc_aw(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		m68ki_write_16(EA_AW_16(), m68ki_get_ccr());
		return;
	}
	m68ki_exception_illegal();
}